

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

class_<ki::dml::Field<int>_> * __thiscall
pybind11::class_<ki::dml::Field<int>>::
def_property<int(ki::dml::Field<int>::*)()const,pybind11::return_value_policy>
          (class_<ki::dml::Field<int>> *this,char *name,offset_in_Field<signed_char>_to_subr *fget,
          cpp_function *fset,return_value_policy *extra)

{
  class_<ki::dml::Field<int>_> *pcVar1;
  return_value_policy local_39;
  cpp_function local_38;
  is_method local_30;
  
  cpp_function::cpp_function<int,ki::dml::Field<int>>(&local_38,*fget);
  local_39 = reference_internal;
  local_30.class_.m_ptr = *(handle *)this;
  pcVar1 = def_property_static<pybind11::is_method,pybind11::return_value_policy,pybind11::return_value_policy>
                     (this,name,&local_38,fset,&local_30,&local_39,extra);
  object::~object((object *)&local_38);
  return pcVar1;
}

Assistant:

class_ &def_property(const char *name, const Getter &fget, const cpp_function &fset, const Extra& ...extra) {
        return def_property(name, cpp_function(method_adaptor<type>(fget)), fset,
                            return_value_policy::reference_internal, extra...);
    }